

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O1

int nscookiejar_iterate(lws_cache_nscookiejar_t *cache,int fd,nsc_cb_t cb,void *opaque)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  size_t sVar4;
  int iVar5;
  __off_t _Var6;
  ulong uVar7;
  size_t sVar8;
  ssize_t sVar9;
  int iVar10;
  ulong uVar11;
  size_t __n;
  size_t sVar12;
  long lVar13;
  int iVar14;
  ulong uVar15;
  char temp [256];
  int local_16c;
  char local_138 [264];
  
  _Var6 = lseek(fd,0,0);
  if (_Var6 == -1) {
    iVar10 = -1;
  }
  else {
    uVar3 = 1;
    uVar15 = 0;
    uVar11 = 0;
    bVar1 = false;
    local_16c = 0;
    bVar2 = false;
    do {
      _lws_log(0x10,"%s: n %d, m %d\n","nscookiejar_iterate",uVar11,uVar15 & 0xffffffff);
      sVar12 = uVar15 & 0xffffffff;
      uVar7 = read(fd,local_138 + sVar12,0x100 - sVar12);
      _lws_log(0x10,"%s: n1 %d\n","nscookiejar_iterate",uVar7 & 0xffffffff);
      if ((int)uVar7 < 1) {
        iVar10 = 3;
        bVar2 = true;
        if ((int)uVar15 != (int)uVar11) goto LAB_0010f725;
      }
      else {
        uVar11 = (ulong)(uint)((int)uVar11 + (int)uVar7);
LAB_0010f725:
        do {
          iVar10 = (int)uVar11;
          uVar15 = (ulong)iVar10;
          lVar13 = sVar12 << 0x20;
          sVar4 = sVar12;
          do {
            sVar8 = sVar4;
            if ((long)uVar15 <= (long)sVar8) {
              if ((long)uVar15 < (long)sVar12) {
                uVar15 = sVar12;
              }
              if (uVar15 == 0) {
                uVar15 = 0;
              }
              else {
                iVar5 = 0;
                if ((bVar1) || (((iVar10 != 0 && (uVar3 == 1)) && (local_138[0] == '#')))) {
                  bVar1 = true;
                }
                else {
                  iVar5 = (*cb)(cache,opaque,SUB14(bVar2 && iVar10 == (int)uVar15,0) * 2 | uVar3,
                                local_138,uVar15 & 0xffffffff);
                  uVar15 = 0;
                  uVar11 = 0;
                  bVar1 = false;
                }
                if (iVar5 != 0) goto LAB_0010f82a;
                uVar3 = 0;
              }
              iVar10 = 0;
              goto LAB_0010f83f;
            }
            lVar13 = lVar13 + 0x100000000;
            sVar4 = sVar8 + 1;
          } while (local_138[sVar8] != '\n');
          bVar1 = false;
          iVar5 = 0;
          if (local_138[0] != '#') {
            iVar5 = (*cb)(cache,opaque,uVar3 | 2,local_138,sVar8);
          }
          iVar14 = (int)(sVar8 + 1);
          __n = (size_t)(iVar10 - iVar14);
          memmove(local_138,local_138 + (lVar13 >> 0x20),__n);
          sVar9 = read(fd,local_138 + __n,0x100 - __n);
          uVar11 = (ulong)(uint)(((int)sVar9 + iVar10) - iVar14);
          uVar3 = 1;
          sVar12 = 0;
        } while (iVar5 == 0);
        uVar11 = (ulong)(uint)((iVar10 + (int)sVar9) - iVar14);
        uVar3 = 1;
        uVar15 = 0;
        bVar1 = false;
LAB_0010f82a:
        iVar10 = 6;
        local_16c = iVar5;
      }
LAB_0010f83f:
      if ((iVar10 != 3) && (iVar10 != 0)) {
        return local_16c;
      }
    } while ((!bVar2) || ((int)uVar11 != (int)uVar15));
    iVar10 = 0;
  }
  return iVar10;
}

Assistant:

static int
nscookiejar_iterate(lws_cache_nscookiejar_t *cache, int fd,
		    nsc_cb_t cb, void *opaque)
{
	int m = 0, n = 0, e, r = LCN_SOL, ignore = 0, ret = 0;
	char temp[256], eof = 0;

	if (lseek(fd, 0, SEEK_SET) == (off_t)-1)
		return -1;

	do { /* for as many buffers in the file */

		int n1;

		lwsl_debug("%s: n %d, m %d\n", __func__, n, m);

		n1 = (int)read(fd, temp + m, sizeof(temp) - (size_t)m);

		lwsl_debug("%s: n1 %d\n", __func__, n1);

		if (n1 <= 0) {
			eof = 1;
			if (m == n)
				continue;
		} else
			n += n1;

		while (m < n) {

			m++;

			if (temp[m - 1] != '\n')
				continue;

			/* ie, we hit EOL */

			if (temp[0] == '#')
				/* lines starting with # are comments */
				e = 0;
			else
				e = cb(cache, opaque, r | LCN_EOL, temp,
				       (size_t)m - 1);
			r = LCN_SOL;
			ignore = 0;
			/*
			 * Move back remainder and prefill the gap that opened
			 * up: we want to pass enough in the start chunk so the
			 * cb can classify it even if it can't get all the
			 * value part in one go
			 */
			memmove(temp, temp + m, (size_t)(n - m));
			n -= m;
			m = 0;

			n1 = (int)read(fd, temp + n, sizeof(temp) - (size_t)n);
			n += n1;

			if (e) {
				ret = e;
				goto bail;
			}
		}

		if (m) {
			/* we ran out of buffer */
			if (ignore || (r == LCN_SOL && n && temp[0] == '#')) {
				e = 0;
				ignore = 1;
			} else {
				e = cb(cache, opaque,
				       r | (n == m && eof ? LCN_EOL : 0),
				       temp, (size_t)m);

				m = 0;
				n = 0;
			}

			if (e) {
				/*
				 * We have to call off the whole thing if any
				 * step, eg, OOMs
				 */
				ret = e;
				goto bail;
			}
			r = 0;
		}

	} while (!eof || n != m);

	ret = 0;

bail:

	return ret;
}